

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::InnerProduct3D_1D_1D::backward_impl
          (InnerProduct3D_1D_1D *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  uint uVar6;
  pointer ppTVar7;
  Tensor *pTVar8;
  Tensor *pTVar9;
  Assign assign;
  Assign assign_1;
  DefaultDevice local_c9;
  type local_c8;
  undefined1 local_b8 [16];
  type *ptStack_a8;
  long local_a0;
  type *local_98;
  array<long,_1> local_90;
  float *pfStack_88;
  undefined1 local_80 [16];
  long local_70;
  float *local_68;
  long local_60;
  undefined8 local_58;
  float *local_50;
  long local_48;
  float *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if ((dEdf->d).nd == 1) {
    if (3 < i) {
      std::operator<<((ostream *)&std::cerr,"shouldn\'t happen\n");
      abort();
    }
    local_40 = dEdf->v;
    local_38 = (long)(int)(dEdf->d).d[0];
    switch(i) {
    case 0:
      ppTVar7 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pTVar8 = ppTVar7[1];
      if (((pTVar8->d).nd == 1) && (pTVar9 = ppTVar7[2], (pTVar9->d).nd == 1)) {
        if ((dEdxi->d).nd == 3) {
          local_b8._0_8_ = dEdxi->v;
          local_c8.m_data = (StoragePointerType)local_b8;
          local_50 = pTVar8->v;
          local_68 = pTVar9->v;
          local_48 = (long)(int)(pTVar8->d).d[0];
          local_60 = (long)(int)(pTVar9->d).d[0];
          local_a0 = (long)(int)(dEdxi->d).d[2];
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)(dEdxi->d).d;
          unique0x000fe280 = vpmovsxdq_avx(auVar1);
          local_c8.m_dimensions.super_array<long,_1>._M_elems[0] = (array<long,_1>)&local_98;
          local_90._M_elems[0] = (_Type)(_Type)local_b8._8_8_;
          pfStack_88 = (float *)ptStack_a8;
          local_80._8_8_ = local_40;
          local_80._0_8_ = local_a0;
          local_98 = (type *)local_b8._0_8_;
          local_70 = local_38;
          Eigen::internal::
          TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_0UL>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_0UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
          ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_0UL>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_0UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>_>_>
                 *)&local_c8,&local_c9);
          return;
        }
        __assert_fail("d.ndims() == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/tensor.h"
                      ,0xb7,"Eigen::TensorMap<Eigen::Tensor<float, 3>> cnn::Tensor::t()");
      }
      break;
    case 1:
      ppTVar7 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pTVar8 = *ppTVar7;
      if ((pTVar8->d).nd != 3) {
LAB_0017bece:
        __assert_fail("d.ndims() == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/tensor.h"
                      ,0xbb,"const Eigen::TensorMap<Eigen::Tensor<float, 3>> cnn::Tensor::t() const"
                     );
      }
      pTVar9 = ppTVar7[2];
      if ((pTVar9->d).nd == 1) {
        if ((dEdxi->d).nd == 1) {
          local_98 = (type *)dEdxi->v;
          uVar4 = (dEdxi->d).d[0];
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(pTVar8->d).d;
          local_80 = vpmovsxdq_avx(auVar3);
          pfStack_88 = pTVar8->v;
          local_68 = pTVar9->v;
          uVar5 = (pTVar8->d).d[2];
          uVar6 = (pTVar9->d).d[0];
          local_58 = 1;
LAB_0017be58:
          local_90._M_elems[0] = (_Type)(long)(int)uVar4;
          local_60 = (long)(int)uVar6;
          local_70 = (long)(int)uVar5;
          local_b8._0_8_ = &local_c8;
          local_50 = (float *)0x0;
          local_30 = (undefined1  [16])0x0;
          ptStack_a8 = (type *)local_b8._8_8_;
          local_b8._8_8_ = &local_98;
          local_c8.m_data = (StoragePointerType)local_98;
          local_c8.m_dimensions.super_array<long,_1>._M_elems[0] =
               (array<long,_1>)(array<long,_1>)local_90._M_elems[0];
          Eigen::internal::
          TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
          ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>_>_>
                 *)local_b8,&local_c9);
          return;
        }
        goto LAB_0017beaf;
      }
      break;
    case 2:
      ppTVar7 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pTVar8 = *ppTVar7;
      if ((pTVar8->d).nd != 3) goto LAB_0017bece;
      pTVar9 = ppTVar7[1];
      if ((pTVar9->d).nd == 1) {
        if ((dEdxi->d).nd == 1) {
          local_98 = (type *)dEdxi->v;
          uVar4 = (dEdxi->d).d[0];
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)(pTVar8->d).d;
          local_80 = vpmovsxdq_avx(auVar2);
          pfStack_88 = pTVar8->v;
          local_68 = pTVar9->v;
          uVar5 = (pTVar8->d).d[2];
          uVar6 = (pTVar9->d).d[0];
          local_58 = 2;
          goto LAB_0017be58;
        }
        goto LAB_0017beaf;
      }
      break;
    case 3:
      if ((dEdxi->d).nd == 1) {
        local_c8.m_data = dEdxi->v;
        local_c8.m_dimensions.super_array<long,_1>._M_elems[0] =
             (array<long,_1>)(long)(int)(dEdxi->d).d[0];
        local_b8._0_8_ = &local_c8;
        ptStack_a8 = (type *)local_b8._8_8_;
        local_b8._8_8_ = &local_98;
        local_80._8_8_ = local_80._0_8_;
        local_80._0_8_ = local_38;
        local_98 = (type *)local_c8.m_data;
        local_90._M_elems[0] = (_Type)(_Type)local_c8.m_dimensions.super_array<long,_1>._M_elems[0];
        pfStack_88 = local_40;
        Eigen::internal::
        TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
        ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>
               *)local_b8,&local_c9);
        return;
      }
LAB_0017beaf:
      __assert_fail("d.ndims() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/tensor.h"
                    ,0xa7,"Eigen::TensorMap<Eigen::Tensor<float, 1>> cnn::Tensor::t()");
    }
  }
  __assert_fail("d.ndims() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/tensor.h"
                ,0xab,"const Eigen::TensorMap<Eigen::Tensor<float, 1>> cnn::Tensor::t() const");
}

Assistant:

void Max::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Max not yet implemented for CUDA");
#else
  auto y = *fx;
  auto x1 = **xs[0];
  auto x2 = **xs[1];
  Tensor t(fx.d, static_cast<float*>(aux_mem));
  auto u = *t;
  u = (x1.array() > x2.array()).matrix().cast<float>();
  y = x1.cwiseMax(x2);
#endif
}